

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CollapseButton(ImGuiID id,ImVec2 *pos)

{
  byte bVar1;
  bool bVar2;
  ImRect *in_RSI;
  ImVec2 bb_00;
  ImVec2 out_hovered;
  ImVec2 center;
  ImU32 text_col;
  ImU32 bg_col;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  ImGuiMouseButton button;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 uVar3;
  undefined4 uVar4;
  ImGuiWindow *window_00;
  ImGuiID in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  ImGuiButtonFlags in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffad;
  byte in_stack_ffffffffffffffae;
  byte in_stack_ffffffffffffffaf;
  undefined1 local_48 [4];
  ImGuiID in_stack_ffffffffffffffbc;
  ImVec2 local_38;
  ImVec2 local_20;
  ImVec2 local_18;
  
  local_18 = (ImVec2)GImGui;
  local_20 = (ImVec2)GImGui->CurrentWindow;
  window_00 = (ImGuiWindow *)local_48;
  ImVec2::ImVec2((ImVec2 *)window_00,GImGui->FontSize,GImGui->FontSize);
  bb_00 = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                    (ImVec2 *)0x196d4a);
  out_hovered = operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          0.0);
  local_38 = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       (ImVec2 *)0x196d81);
  ImRect::ImRect((ImRect *)&stack0xffffffffffffffd0,&in_RSI->Min,&stack0xffffffffffffffc8);
  ItemAdd((ImRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
          in_stack_ffffffffffffff94,in_RSI,(ImGuiItemFlags)((ulong)window_00 >> 0x20));
  bVar1 = ButtonBehavior((ImRect *)bb_00,in_stack_ffffffffffffffbc,(bool *)out_hovered,
                         (bool *)CONCAT17(in_stack_ffffffffffffffaf,
                                          CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT15(in_stack_ffffffffffffffad,
                                                            CONCAT14(in_stack_ffffffffffffffac,
                                                                     in_stack_ffffffffffffffa8)))),
                         in_stack_ffffffffffffffa4);
  if (((in_stack_ffffffffffffffae & 1) == 0) || ((in_stack_ffffffffffffffaf & 1) == 0)) {
    uVar4 = 0x15;
    if ((in_stack_ffffffffffffffaf & 1) != 0) {
      uVar4 = 0x16;
    }
  }
  else {
    uVar4 = 0x17;
  }
  uVar3 = 0x3f800000;
  GetColorU32((ImGuiCol)((ulong)window_00 >> 0x20),SUB84(window_00,0));
  GetColorU32((ImGuiCol)((ulong)window_00 >> 0x20),SUB84(window_00,0));
  ImRect::GetCenter((ImRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (((in_stack_ffffffffffffffaf & 1) != 0) || ((in_stack_ffffffffffffffae & 1) != 0)) {
    ImDrawList::AddCircleFilled
              ((ImDrawList *)window_00,(ImVec2 *)CONCAT44(uVar4,uVar3),
               (float)((ulong)in_stack_ffffffffffffff70 >> 0x20),(ImU32)in_stack_ffffffffffffff70,
               (int)in_stack_ffffffffffffff6c);
  }
  button = (ImGuiMouseButton)*(ImDrawList **)((long)local_20 + 0x270);
  operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
            (ImVec2 *)0x196ec2);
  RenderArrow((ImDrawList *)window,(ImVec2)g,(ImU32)bb.Max.y,(ImGuiDir)bb.Max.x,bb.Min.y);
  bVar2 = IsItemActive();
  if ((bVar2) && (bVar2 = IsMouseDragging(button,in_stack_ffffffffffffff6c), bVar2)) {
    StartMouseMovingWindow(window_00);
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ImGui::CollapseButton(ImGuiID id, const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ItemAdd(bb, id);
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_None);

    // Render
    ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    ImVec2 center = bb.GetCenter();
    if (hovered || held)
        window->DrawList->AddCircleFilled(center/*+ ImVec2(0.0f, -0.5f)*/, g.FontSize * 0.5f + 1.0f, bg_col, 12);
    RenderArrow(window->DrawList, bb.Min + g.Style.FramePadding, text_col, window->Collapsed ? ImGuiDir_Right : ImGuiDir_Down, 1.0f);

    // Switch to moving the window after mouse is moved beyond the initial drag threshold
    if (IsItemActive() && IsMouseDragging(0))
        StartMouseMovingWindow(window);

    return pressed;
}